

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall SVGChart::PPlot::DrawXAxis(PPlot *this,PRect *inRect,Painter *inPainter)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  PStyle *pPVar10;
  float fVar11;
  float extraout_XMM0_Da;
  bool theIsMajorTick;
  float theX;
  string theLabel;
  string theFormatString;
  PRect theTickRect;
  byte local_c9;
  float local_c8;
  undefined4 local_c4;
  long local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long local_78;
  PStyle *local_70;
  long local_68;
  long local_60;
  undefined8 local_58;
  long lStack_50;
  undefined8 local_48;
  long lStack_40;
  
  pPVar10 = &(this->mXAxisSetup).mStyle;
  (*inPainter->_vptr_Painter[0xc])(inPainter,pPVar10);
  local_c8 = (float)inRect->mX;
  fVar11 = 0.0;
  if ((this->mXAxisSetup).mCrossOrigin == false) {
    if ((this->mYAxisSetup).mAscending == true) {
      fVar11 = (this->mYAxisSetup).mMax;
    }
    else {
      fVar11 = (this->mYAxisSetup).mMin;
    }
  }
  (*this->mYTrafo->_vptr_Trafo[2])(fVar11);
  fVar11 = extraout_XMM0_Da;
  (**inPainter->_vptr_Painter)
            (local_c8,extraout_XMM0_Da,(float)inRect->mW + local_c8,extraout_XMM0_Da,inPainter);
  local_c8 = fVar11;
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mXAxisSetup).mTickInfo.mStyle);
  iVar2 = (*this->mXTickIterator->_vptr_TickIterator[2])();
  if ((char)iVar2 == '\0') {
    bVar6 = false;
  }
  else {
    local_98 = &local_88;
    local_90 = 0;
    local_88 = 0;
    local_48 = 0;
    lStack_40 = 0;
    local_58 = 0;
    lStack_50 = 0;
    local_60 = inRect->mX;
    local_c0 = inRect->mY;
    local_68 = inRect->mW;
    uVar8 = 0;
    lVar5 = inRect->mH;
    if ((this->mXAxisSetup).mTickInfo.mTicksOn == true) {
      local_78 = inRect->mH;
      local_70 = pPVar10;
      while( true ) {
        iVar2 = (*this->mXTickIterator->_vptr_TickIterator[3])
                          (this->mXTickIterator,&local_c4,&local_c9,&local_98);
        uVar7 = (uint)uVar8;
        if ((char)iVar2 == '\0') break;
        iVar2 = (*(this->super_PDrawer)._vptr_PDrawer[0xc])
                          (local_c4,this,(ulong)(uint)(int)local_c8,(ulong)local_c9,&local_98,
                           inPainter,&local_58);
        if ((char)iVar2 == '\0') {
          bVar6 = false;
          goto LAB_00106762;
        }
        uVar3 = (uint)(lStack_40 + lStack_50);
        if (lStack_40 + lStack_50 <= (long)(int)uVar7) {
          uVar3 = uVar7;
        }
        uVar8 = (ulong)uVar3;
      }
      uVar8 = (ulong)(int)uVar7;
      lVar5 = local_78;
      pPVar10 = local_70;
    }
    lVar9 = uVar8 - local_c0;
    if ((long)uVar8 <= lVar5 + local_c0) {
      lVar9 = lVar5;
    }
    (*inPainter->_vptr_Painter[0xc])(inPainter,pPVar10);
    pcVar1 = (this->mXAxisSetup).mLabel._M_dataplus._M_p;
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar1,pcVar1 + (this->mXAxisSetup).mLabel._M_string_length);
    if (local_b0 != 0) {
      iVar2 = (*inPainter->_vptr_Painter[8])(inPainter,local_b8);
      iVar4 = (*inPainter->_vptr_Painter[9])(inPainter);
      (*inPainter->_vptr_Painter[10])
                (inPainter,
                 (ulong)(uint)((int)local_60 +
                              (int)((ulong)((local_68 - iVar2) - (local_68 - iVar2 >> 0x3f)) >> 1)),
                 (ulong)(uint)(iVar4 + (int)lVar9 + (int)local_c0),local_b8);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    bVar6 = true;
LAB_00106762:
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
  }
  return bVar6;
}

Assistant:

bool PPlot::DrawXAxis (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mXAxisSetup.mStyle);

      float theX1 = inRect.mX;
      float theY1;
      float theTargetY = 0;
      if (!mXAxisSetup.mCrossOrigin) {
        if (mYAxisSetup.mAscending) {
          theTargetY = mYAxisSetup.mMax;
        } else {
          theTargetY = mYAxisSetup.mMin;
        }
      }
      theY1 = mYTrafo->Transform (theTargetY);

      // x-axis
      float theX2 = theX1+inRect.mW;
      float theY2 = theY1;
      inPainter.DrawLine (theX1, theY1, theX2, theY2);

      // ticks
      inPainter.SetStyle (mXAxisSetup.mTickInfo.mStyle);
      if (!mXTickIterator->Init ()) {
        return false;
      }

      float theX;
      bool theIsMajorTick;
      string theFormatString;

      int theYMax = 0;
      PRect theTickRect;
      PRect theRect = inRect;

      if (mXAxisSetup.mTickInfo.mTicksOn) {
          while (mXTickIterator->GetNextTick (theX, theIsMajorTick, theFormatString)) {
              if (!DrawXTick (theX, theY1, theIsMajorTick, theFormatString, inPainter, theTickRect)) {
                  return false;
              }
              
              if (theTickRect.mY+theTickRect.mH>theYMax) {
                  theYMax = theTickRect.mY+theTickRect.mH;
              }
          }
      }

      if (theYMax>theRect.mY+theRect.mH) {
        theRect.mH = theYMax-theRect.mY;
      }

      inPainter.SetStyle (mXAxisSetup.mStyle);
      string theLabel = mXAxisSetup.mLabel;
      if (theLabel.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theLabel.c_str ());
        int theX = theRect.mX + (theRect.mW-theW)/2;
        int theY = theRect.mY+theRect.mH+inPainter.GetFontHeight ();
        inPainter.DrawText (theX, theY, theLabel.c_str ());
      }
      return true;
    }